

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cram_io.c
# Opt level: O0

SAM_hdr * cram_read_SAM_hdr(cram_fd *fd)

{
  int iVar1;
  long lVar2;
  ssize_t sVar3;
  cram_container *c_00;
  cram_block *pcVar4;
  void *buffer;
  SAM_hdr *pSVar5;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_a8;
  int local_a4;
  int local_a0;
  int local_98;
  int local_94;
  int local_90;
  int local_88;
  int local_84;
  int local_80;
  int local_78;
  int local_74;
  int local_70;
  int local_68;
  int local_64;
  int local_60;
  char *pads;
  int len;
  int i;
  cram_block *b;
  cram_container *c;
  SAM_hdr *hdr;
  char *header;
  cram_fd *pcStack_18;
  int32_t header_len;
  cram_fd *fd_local;
  
  pcStack_18 = fd;
  if (fd->version >> 8 == 1) {
    iVar1 = int32_decode(fd,(int32_t *)((long)&header + 4));
    if (iVar1 == -1) {
      return (SAM_hdr *)0x0;
    }
    hdr = (SAM_hdr *)malloc((long)(header._4_4_ + 1));
    if (hdr == (SAM_hdr *)0x0) {
      return (SAM_hdr *)0x0;
    }
    *(undefined1 *)&(hdr->text).l = 0;
    lVar2 = (long)header._4_4_;
    sVar3 = hread(pcStack_18->fp,hdr,(long)header._4_4_);
    if (lVar2 != sVar3) {
      return (SAM_hdr *)0x0;
    }
    pcStack_18->first_container = (long)(header._4_4_ + 4) + pcStack_18->first_container;
  }
  else {
    c_00 = cram_read_container(fd);
    if (c_00 == (cram_container *)0x0) {
      return (SAM_hdr *)0x0;
    }
    if (c_00->num_blocks < 1) {
      cram_free_container(c_00);
      return (SAM_hdr *)0x0;
    }
    pcVar4 = cram_read_block(pcStack_18);
    if (pcVar4 == (cram_block *)0x0) {
      cram_free_container(c_00);
      return (SAM_hdr *)0x0;
    }
    cram_uncompress_block(pcVar4);
    if ((pcVar4->content_id & 0xffffff80U) == 0) {
      local_60 = 1;
    }
    else {
      if ((pcVar4->content_id & 0xffffc000U) == 0) {
        local_64 = 2;
      }
      else {
        if ((pcVar4->content_id & 0xffe00000U) == 0) {
          local_68 = 3;
        }
        else {
          local_68 = 5;
          if ((pcVar4->content_id & 0xf0000000U) == 0) {
            local_68 = 4;
          }
        }
        local_64 = local_68;
      }
      local_60 = local_64;
    }
    if ((pcVar4->uncomp_size & 0xffffff80U) == 0) {
      local_70 = 1;
    }
    else {
      if ((pcVar4->uncomp_size & 0xffffc000U) == 0) {
        local_74 = 2;
      }
      else {
        if ((pcVar4->uncomp_size & 0xffe00000U) == 0) {
          local_78 = 3;
        }
        else {
          local_78 = 5;
          if ((pcVar4->uncomp_size & 0xf0000000U) == 0) {
            local_78 = 4;
          }
        }
        local_74 = local_78;
      }
      local_70 = local_74;
    }
    if ((pcVar4->comp_size & 0xffffff80U) == 0) {
      local_80 = 1;
    }
    else {
      if ((pcVar4->comp_size & 0xffffc000U) == 0) {
        local_84 = 2;
      }
      else {
        if ((pcVar4->comp_size & 0xffe00000U) == 0) {
          local_88 = 3;
        }
        else {
          local_88 = 5;
          if ((pcVar4->comp_size & 0xf0000000U) == 0) {
            local_88 = 4;
          }
        }
        local_84 = local_88;
      }
      local_80 = local_84;
    }
    pads._0_4_ = pcVar4->comp_size + 2 + (uint)(2 < pcStack_18->version >> 8) * 4 + local_60 +
                 local_70 + local_80;
    iVar1 = int32_get(pcVar4,(int32_t *)((long)&header + 4));
    if ((iVar1 == -1) || (pcVar4->uncomp_size + -4 < header._4_4_)) {
      cram_free_container(c_00);
      cram_free_block(pcVar4);
      return (SAM_hdr *)0x0;
    }
    hdr = (SAM_hdr *)malloc((long)(header._4_4_ + 1));
    if (hdr == (SAM_hdr *)0x0) {
      cram_free_container(c_00);
      cram_free_block(pcVar4);
      return (SAM_hdr *)0x0;
    }
    memcpy(hdr,pcVar4->data + pcVar4->byte,(long)header._4_4_);
    *(undefined1 *)((long)&(hdr->text).l + (long)header._4_4_) = 0;
    cram_free_block(pcVar4);
    for (pads._4_4_ = 1; pads._4_4_ < c_00->num_blocks; pads._4_4_ = pads._4_4_ + 1) {
      pcVar4 = cram_read_block(pcStack_18);
      if (pcVar4 == (cram_block *)0x0) {
        cram_free_container(c_00);
        return (SAM_hdr *)0x0;
      }
      if ((pcVar4->content_id & 0xffffff80U) == 0) {
        local_90 = 1;
      }
      else {
        if ((pcVar4->content_id & 0xffffc000U) == 0) {
          local_94 = 2;
        }
        else {
          if ((pcVar4->content_id & 0xffe00000U) == 0) {
            local_98 = 3;
          }
          else {
            local_98 = 5;
            if ((pcVar4->content_id & 0xf0000000U) == 0) {
              local_98 = 4;
            }
          }
          local_94 = local_98;
        }
        local_90 = local_94;
      }
      if ((pcVar4->uncomp_size & 0xffffff80U) == 0) {
        local_a0 = 1;
      }
      else {
        if ((pcVar4->uncomp_size & 0xffffc000U) == 0) {
          local_a4 = 2;
        }
        else {
          if ((pcVar4->uncomp_size & 0xffe00000U) == 0) {
            local_a8 = 3;
          }
          else {
            local_a8 = 5;
            if ((pcVar4->uncomp_size & 0xf0000000U) == 0) {
              local_a8 = 4;
            }
          }
          local_a4 = local_a8;
        }
        local_a0 = local_a4;
      }
      if ((pcVar4->comp_size & 0xffffff80U) == 0) {
        local_b0 = 1;
      }
      else {
        if ((pcVar4->comp_size & 0xffffc000U) == 0) {
          local_b4 = 2;
        }
        else {
          if ((pcVar4->comp_size & 0xffe00000U) == 0) {
            local_b8 = 3;
          }
          else {
            local_b8 = 5;
            if ((pcVar4->comp_size & 0xf0000000U) == 0) {
              local_b8 = 4;
            }
          }
          local_b4 = local_b8;
        }
        local_b0 = local_b4;
      }
      pads._0_4_ = pcVar4->comp_size + 2 + (uint)(2 < pcStack_18->version >> 8) * 4 + local_90 +
                   local_a0 + local_b0 + (int)pads;
      cram_free_block(pcVar4);
    }
    if ((c_00->length != 0) && ((int)pads < c_00->length)) {
      buffer = malloc((long)(c_00->length - (int)pads));
      if (buffer == (void *)0x0) {
        cram_free_container(c_00);
        return (SAM_hdr *)0x0;
      }
      iVar1 = c_00->length;
      sVar3 = hread(pcStack_18->fp,buffer,(long)(c_00->length - (int)pads));
      if (iVar1 - (int)pads != sVar3) {
        cram_free_container(c_00);
        return (SAM_hdr *)0x0;
      }
      free(buffer);
    }
    cram_free_container(c_00);
  }
  pSVar5 = sam_hdr_parse_((char *)hdr,header._4_4_);
  free(hdr);
  return pSVar5;
}

Assistant:

SAM_hdr *cram_read_SAM_hdr(cram_fd *fd) {
    int32_t header_len;
    char *header;
    SAM_hdr *hdr;

    /* 1.1 onwards stores the header in the first block of a container */
    if (CRAM_MAJOR_VERS(fd->version) == 1) {
	/* Length */
	if (-1 == int32_decode(fd, &header_len))
	    return NULL;

	/* Alloc and read */
	if (NULL == (header = malloc(header_len+1)))
	    return NULL;

	*header = 0;
	if (header_len != hread(fd->fp, header, header_len))
	    return NULL;

	fd->first_container += 4 + header_len;
    } else {
	cram_container *c = cram_read_container(fd);
	cram_block *b;
	int i, len;

	if (!c)
	    return NULL;

	if (c->num_blocks < 1) {
	    cram_free_container(c);
	    return NULL;
	}

	if (!(b = cram_read_block(fd))) {
	    cram_free_container(c);
	    return NULL;
	}
	cram_uncompress_block(b);

	len = b->comp_size + 2 + 4*(CRAM_MAJOR_VERS(fd->version) >= 3) +
	    itf8_size(b->content_id) + 
	    itf8_size(b->uncomp_size) + 
	    itf8_size(b->comp_size);

	/* Extract header from 1st block */
	if (-1 == int32_get(b, &header_len) ||
	    b->uncomp_size - 4 < header_len) {
	    cram_free_container(c);
	    cram_free_block(b);
	    return NULL;
	}
	if (NULL == (header = malloc(header_len+1))) {
	    cram_free_container(c);
	    cram_free_block(b);
	    return NULL;
	}
	memcpy(header, BLOCK_END(b), header_len);
	header[header_len]='\0';
	cram_free_block(b);

	/* Consume any remaining blocks */
	for (i = 1; i < c->num_blocks; i++) {
	    if (!(b = cram_read_block(fd))) {
		cram_free_container(c);
		return NULL;
	    }
	    len += b->comp_size + 2 + 4*(CRAM_MAJOR_VERS(fd->version) >= 3) +
		itf8_size(b->content_id) + 
		itf8_size(b->uncomp_size) + 
		itf8_size(b->comp_size);
	    cram_free_block(b);
	}

	if (c->length && c->length > len) {
	    // Consume padding
	    char *pads = malloc(c->length - len);
	    if (!pads) {
		cram_free_container(c);
		return NULL;
	    }

	    if (c->length - len != hread(fd->fp, pads, c->length - len)) {
		cram_free_container(c);
		return NULL;
	    }
	    free(pads);
	}

	cram_free_container(c);
    }

    /* Parse */
    hdr = sam_hdr_parse_(header, header_len);
    free(header);

    return hdr;
}